

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_3_6d7b35ba_for_proto *pp;
  int *piVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  ftpstate instate;
  char cVar4;
  uchar uVar5;
  ConnectBits CVar6;
  FTP *pFVar7;
  FILEPROTO *pFVar8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  proxy_info *ppVar12;
  char *pcVar13;
  _Bool _Var14;
  CURLcode CVar15;
  int iVar16;
  void *pvVar17;
  size_t sVar18;
  ulong uVar19;
  time_t tVar20;
  char *pcVar21;
  char *pcVar22;
  byte bVar23;
  ftpport fcmd;
  size_t sVar24;
  curl_off_t cVar25;
  connectdata *pcVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  connectdata *conn_1;
  uint uVar30;
  uint uVar31;
  int i;
  long lVar32;
  Curl_dns_entry *addr;
  ulong local_190;
  int ftpcode;
  connectdata *local_180;
  curl_off_t filesize;
  uint local_170;
  uint local_16c;
  int local_168;
  int local_164;
  int local_160;
  size_t nread;
  curl_off_t size;
  undefined8 uStack_130;
  size_t local_128;
  
  nread = 0;
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar15 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar15;
  }
  CVar15 = ftp_readresp(data,conn->sock[0],&(pp->ftpc).pp,&ftpcode,&nread);
  if (CVar15 != CURLE_OK) {
    return CVar15;
  }
  local_190 = (ulong)(uint)ftpcode;
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case '\x01':
    if (ftpcode == 0xdc) {
      if ((data->set).use_ssl == '\0') goto LAB_004f88a2;
    }
    else {
      if (ftpcode != 0xe6) {
        Curl_failf(data,"Got a %03d ftp-server response when 220 was expected");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((data->set).use_ssl < 2) || (((conn->bits).field_0x2 & 0x10) != 0)) {
        ftpcode = 0xe6;
        goto LAB_004f7a5b;
      }
    }
    if (((conn->bits).field_0x2 & 0x10) == 0) {
      (conn->proto).ftpc.count3 = 0;
      bVar23 = (data->set).ftpsslauth;
      if (2 < bVar23) {
        Curl_failf(data,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
        return CURLE_UNKNOWN_OPTION;
      }
      iVar16 = *(int *)(&DAT_006f40d0 + (uint)bVar23 * 4);
      lVar32 = *(long *)(&DAT_006f40e0 + (ulong)(uint)bVar23 * 8);
      (conn->proto).ftpc.count2 = *(int *)(&DAT_006f40c4 + (uint)bVar23 * 4);
      (conn->proto).ftpc.count1 = iVar16;
      CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",ftp_statemachine::ftpauth[lVar32]);
      if (CVar15 == CURLE_OK) {
        (data->conn->proto).ftpc.state = '\x02';
        return CURLE_OK;
      }
      return CVar15;
    }
LAB_004f88a2:
    CVar15 = ftp_state_user(data,conn);
    return CVar15;
  case '\x02':
    if ((conn->proto).ftpc.pp.overflow != 0) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if ((ftpcode == 0x14e) || (ftpcode == 0xea)) {
      _Var14 = Curl_conn_is_ssl(conn,0);
      if ((!_Var14) && (CVar15 = Curl_ssl_cfilter_add(data,conn,0), CVar15 != CURLE_OK)) {
        return CURLE_USE_SSL_FAILED;
      }
      CVar15 = Curl_conn_connect(data,0,true,(_Bool *)&size);
      if (CVar15 != CURLE_OK) {
        return CVar15;
      }
      conn->bits = (ConnectBits)((uint)conn->bits & 0xffe7ffff | 0x100000);
      goto LAB_004f88a2;
    }
    iVar16 = (conn->proto).ftpc.count3;
    if (0 < iVar16) {
      if (1 < (data->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
      goto LAB_004f88a2;
    }
    (conn->proto).ftpc.count3 = iVar16 + 1;
    lVar32 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
    (conn->proto).ftpc.count1 = (int)lVar32;
    pcVar21 = ftp_statemachine::ftpauth[lVar32];
    pcVar22 = "AUTH %s";
    goto LAB_004f80ea;
  case '\x03':
  case '\x04':
LAB_004f7a5b:
    CVar15 = ftp_state_user_resp(data,ftpcode);
    break;
  case '\x05':
    if (ftpcode == 0xe6) {
      CVar15 = ftp_state_loggedin(data);
    }
    else {
      Curl_failf(data,"ACCT rejected by server: %03d");
      CVar15 = CURLE_FTP_WEIRD_PASS_REPLY;
    }
    break;
  case '\x06':
    uVar11 = 0x50;
    if ((data->set).use_ssl == '\x02') {
      uVar11 = 0x43;
    }
    CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PROT %c",uVar11);
    if (CVar15 == CURLE_OK) {
      (data->conn->proto).ftpc.state = '\a';
      CVar15 = CURLE_OK;
    }
    break;
  case '\a':
    bVar23 = (data->set).use_ssl;
    if (ftpcode - 200U < 100) {
      conn->bits = (ConnectBits)((uint)conn->bits & 0xfff7ffff | (uint)(bVar23 != 2) << 0x13);
    }
    else if (2 < bVar23) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((data->set).ftp_ccc != '\0') {
      CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","CCC");
      if (CVar15 == CURLE_OK) {
        (data->conn->proto).ftpc.state = '\b';
        return CURLE_OK;
      }
      return CVar15;
    }
    goto LAB_004f82d9;
  case '\b':
    if ((ftpcode < 500) && (CVar15 = Curl_ssl_cfilter_remove(data,0), CVar15 != CURLE_OK)) {
      Curl_failf(data,"Failed to clear the command channel (CCC)");
      return CVar15;
    }
LAB_004f82d9:
    CVar15 = ftp_state_pwd(data,conn);
    break;
  case '\t':
    if (ftpcode == 0x101) {
      pcVar21 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      Curl_dyn_init((dynbuf *)&size,1000);
      for (pcVar21 = pcVar21 + 4; (cVar4 = *pcVar21, cVar4 != '\0' && (cVar4 != '\n'));
          pcVar21 = pcVar21 + 1) {
        if (cVar4 == '\"') goto LAB_004f8847;
      }
LAB_004f8b2b:
      Curl_dyn_free((dynbuf *)&size);
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"Failed to figure out path");
      }
    }
  default:
switchD_004f7946_default:
    (data->conn->proto).ftpc.state = '\0';
    CVar15 = CURLE_OK;
    break;
  case '\n':
    if (ftpcode == 0xd7) {
      pcVar21 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      pcVar21 = pcVar21 + 3;
      do {
        pcVar22 = pcVar21;
        bVar23 = pcVar22[1];
        pcVar21 = pcVar22 + 1;
      } while (bVar23 == 0x20);
      sVar24 = 0;
      while ((bVar23 & 0xdf) != 0) {
        lVar32 = sVar24 + 2;
        sVar24 = sVar24 + 1;
        bVar23 = pcVar22[lVar32];
      }
      pcVar21 = (char *)Curl_memdup0(pcVar22 + 1,sVar24);
      if (pcVar21 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar16 = curl_strequal(pcVar21,"OS/400");
      if (iVar16 != 0) {
        CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar15 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = pcVar21;
          (data->conn->proto).ftpc.state = '\v';
          return CURLE_OK;
        }
        (*Curl_cfree)(pcVar21);
        return CVar15;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar21;
    }
    goto switchD_004f7946_default;
  case '\v':
    if (ftpcode == 0xfa) {
      ftp_state_pwd(data,conn);
      return CURLE_OK;
    }
    goto switchD_004f7946_default;
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
    if ((ftpcode < 400) || ((conn->proto).ftpc.count2 != 0)) {
      CVar15 = ftp_state_quote(data,false,instate);
    }
    else {
      Curl_failf(data,"QUOT command failed with %03d");
      CVar15 = CURLE_QUOTE_ERROR;
    }
    break;
  case '\x10':
    if (99 < ftpcode - 200U) {
      uVar5 = (data->set).ftp_create_missing_dirs;
      if (((uVar5 != '\0') && (lVar32 = (long)(conn->proto).ftpc.cwdcount, lVar32 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        *(uint *)((long)&conn->proto + 0x108) = (uint)(uVar5 == '\x02');
        CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,"MKD %s",(conn->proto).ftpc.dirs[lVar32 + -1]);
        if (CVar15 == CURLE_OK) {
          (data->conn->proto).ftpc.state = '\x11';
          return CURLE_OK;
        }
        return CVar15;
      }
      Curl_failf(data,"Server denied you to change to the given directory");
      pbVar2 = (byte *)((long)&conn->proto + 0x112);
      *pbVar2 = *pbVar2 | 0x10;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar16 = (conn->proto).ftpc.cwdcount;
    (conn->proto).ftpc.cwdcount = iVar16 + 1;
    if ((conn->proto).ftpc.dirdepth <= iVar16) {
      CVar15 = ftp_state_mdtm(data);
      return CVar15;
    }
    pcVar21 = (conn->proto).ftpc.dirs[iVar16];
    goto LAB_004f80e3;
  case '\x11':
    if (99 < ftpcode - 200U) {
      piVar1 = &(conn->proto).ftpc.count3;
      iVar16 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar16 == 0) {
        Curl_failf(data,"Failed to MKD dir: %03d");
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (data->conn->proto).ftpc.state = '\x10';
    pcVar21 = (conn->proto).ftpc.dirs[(long)(conn->proto).ftpc.cwdcount + -1];
LAB_004f80e3:
    pcVar22 = "CWD %s";
LAB_004f80ea:
    CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,pcVar22,pcVar21);
    break;
  case '\x12':
    pFVar8 = (data->req).p.file;
    if (ftpcode == 0x226) {
      if (((data->set).field_0x8bd & 0x10) != 0) {
        pcVar21 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_004f8605:
        Curl_infof(data,pcVar21);
      }
    }
    else if (ftpcode == 0xd5) {
      pcVar26 = data->conn;
      pcVar21 = Curl_dyn_ptr(&(pcVar26->proto).ftpc.pp.recvbuf);
      sVar18 = strlen(pcVar21 + 4);
      if ((((0xd < sVar18) && (uVar31 = pcVar21[9] + -0x210 + pcVar21[8] * 10, (int)uVar31 < 0xd))
          && (uVar27 = pcVar21[0xb] + -0x210 + pcVar21[10] * 10, (int)uVar27 < 0x20)) &&
         (((uVar28 = pcVar21[0xd] + -0x210 + pcVar21[0xc] * 10, (int)uVar28 < 0x18 &&
           (uVar29 = pcVar21[0xf] + -0x210 + pcVar21[0xe] * 10, (int)uVar29 < 0x3c)) &&
          (uVar30 = pcVar21[0x11] + -0x210 + pcVar21[0x10] * 10, (int)uVar30 < 0x3d)))) {
        curl_msnprintf((char *)&size,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",
                       (ulong)((((int)pcVar21[5] + pcVar21[4] * 10) * 100 +
                               (int)pcVar21[7] + pcVar21[6] * 10) - 0xd050),(ulong)uVar31,
                       (ulong)uVar27,(ulong)uVar28,(ulong)uVar29,(ulong)uVar30);
        tVar20 = Curl_getdate_capped((char *)&size);
        (data->info).filetime = tVar20;
      }
      if (((((data->req).field_0xbc & 0x10) != 0) && ((pcVar26->proto).ftpc.file != (char *)0x0)) &&
         ((((data->set).field_0x8ba & 0x80) != 0 && (lVar32 = (data->info).filetime, -1 < lVar32))))
      {
        CVar15 = Curl_gmtime(lVar32,(tm *)&filesize);
        if (CVar15 != CURLE_OK) {
          return CVar15;
        }
        iVar16 = 6;
        if (local_160 != 0) {
          iVar16 = local_160 + -1;
        }
        iVar16 = curl_msnprintf((char *)&size,0x80,
                                "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                                Curl_wkday[iVar16],(ulong)local_16c,Curl_month[local_168],
                                (ulong)(local_164 + 0x76c),(ulong)local_170,(ulong)filesize >> 0x20,
                                filesize & 0xffffffff);
        CVar15 = client_write_header(data,(char *)&size,(long)iVar16);
        if (CVar15 != CURLE_OK) {
          return CVar15;
        }
      }
    }
    else if (((data->set).field_0x8bd & 0x10) != 0) {
      pcVar21 = "unsupported MDTM reply format";
      goto LAB_004f8605;
    }
    uVar5 = (data->set).timecondition;
    if (uVar5 != '\0') {
      uVar19 = (data->info).filetime;
      if (((long)uVar19 < 1) || (uVar10 = (data->set).timevalue, (long)uVar10 < 1)) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"Skipping time comparison");
        }
      }
      else if (uVar5 == '\x02') {
        if (uVar10 < uVar19) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            pcVar21 = "The requested document is not old enough";
LAB_004f8a5c:
            Curl_infof(data,pcVar21);
          }
LAB_004f8a66:
          pFVar8->fd = 2;
          puVar3 = &(data->info).field_0xe4;
          *puVar3 = *puVar3 | 1;
          goto switchD_004f7946_default;
        }
      }
      else if (uVar19 <= uVar10) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          pcVar21 = "The requested document is not new enough";
          goto LAB_004f8a5c;
        }
        goto LAB_004f8a66;
      }
    }
    CVar15 = ftp_state_type(data);
    break;
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x16':
    CVar15 = ftp_state_type_resp(data,ftpcode,instate);
    break;
  case '\x17':
  case '\x18':
  case '\x19':
    filesize = -1;
    pcVar21 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
    if (ftpcode == 0xd5) {
      pcVar21 = pcVar21 + 4;
      pvVar17 = memchr(pcVar21,0xd,(data->conn->proto).ftpc.pp.nfinal);
      pcVar22 = pcVar21;
      if (pvVar17 != (void *)0x0) {
        pcVar13 = (char *)((long)pvVar17 + -2);
        if (*(char *)((long)pvVar17 + -1) != '\n') {
          pcVar13 = (char *)((long)pvVar17 + -1);
        }
        do {
          pcVar22 = pcVar13;
          if (pcVar22 <= pcVar21) break;
          pcVar13 = pcVar22 + -1;
        } while ((byte)(pcVar22[-1] - 0x30U) < 10);
      }
      curlx_strtoofft(pcVar22,(char **)0x0,10,&filesize);
    }
    else if (instate != '\x19' && ftpcode == 0x226) {
      Curl_failf(data,"The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    if (instate == '\x19') {
      (data->state).resume_from = filesize;
      CVar15 = ftp_state_ul_setup(data,true);
    }
    else if (instate == '\x18') {
      Curl_pgrsSetDownloadSize(data,filesize);
      CVar15 = ftp_state_retr(data,filesize);
    }
    else {
      CVar15 = CURLE_OK;
      if (instate == '\x17') {
        if (filesize == -1) {
          cVar25 = -1;
        }
        else {
          iVar16 = curl_msnprintf((char *)&size,0x80,"Content-Length: %ld\r\n");
          CVar15 = client_write_header(data,(char *)&size,(long)iVar16);
          cVar25 = filesize;
          if (CVar15 != CURLE_OK) {
            return CVar15;
          }
        }
        Curl_pgrsSetDownloadSize(data,cVar25);
        CVar15 = ftp_state_rest(data,data->conn);
      }
    }
    break;
  case '\x1a':
  case '\x1b':
    if (instate == '\x1b') {
      if (ftpcode == 0x15e) {
        CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
        if (CVar15 == CURLE_OK) {
          (data->conn->proto).ftpc.state = ' ';
          CVar15 = CURLE_OK;
        }
      }
      else {
        Curl_failf(data,"Couldn\'t use REST");
        CVar15 = CURLE_FTP_COULDNT_USE_REST;
      }
    }
    else {
      if (ftpcode == 0x15e) {
        size._0_1_ = 'A';
        size._1_1_ = 'c';
        size._2_1_ = 'c';
        size._3_1_ = 'e';
        size._4_1_ = 'p';
        size._5_1_ = 't';
        size._6_1_ = '-';
        size._7_1_ = 'r';
        uStack_130._0_1_ = 'a';
        uStack_130._1_1_ = 'n';
        uStack_130._2_1_ = 'g';
        uStack_130._3_1_ = 'e';
        uStack_130._4_1_ = 's';
        uStack_130._5_1_ = ':';
        uStack_130._6_1_ = ' ';
        uStack_130._7_1_ = 'b';
        local_128 = 0xa0d73657479;
        sVar18 = strlen((char *)&size);
        CVar15 = client_write_header(data,(char *)&size,sVar18);
        if (CVar15 != CURLE_OK) {
          return CVar15;
        }
      }
      CVar15 = ftp_state_prepare_transfer(data);
    }
    break;
  case '\x1c':
    pcVar26 = data->conn;
    if (ftpcode - 200U < 100) {
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"Connect data stream actively");
        pcVar26 = data->conn;
      }
      (pcVar26->proto).ftpc.state = '\0';
      CVar15 = ftp_dophase_done(data,false);
    }
    else {
      iVar16 = (pcVar26->proto).ftpc.count1;
      if (iVar16 == 0) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"disabling EPRT usage");
        }
        puVar3 = &(pcVar26->bits).field_0x2;
        *puVar3 = *puVar3 & 0xfb;
        fcmd = PORT;
      }
      else {
        fcmd = iVar16 + PORT;
        if (fcmd == DONE) {
          Curl_failf(data,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar15 = ftp_state_use_port(data,fcmd);
    }
    break;
  case '\x1d':
    if (ftpcode == 200) {
      CVar15 = ftp_state_use_pasv(data,conn);
    }
    else {
      Curl_failf(data,"PRET command not accepted: %03d");
      CVar15 = CURLE_FTP_PRET_FAILED;
    }
    break;
  case '\x1e':
    pcVar26 = data->conn;
    addr = (Curl_dns_entry *)0x0;
    pcVar21 = Curl_dyn_ptr(&(pcVar26->proto).ftpc.pp.recvbuf);
    pcVar21 = pcVar21 + 4;
    (*Curl_cfree)((pcVar26->proto).ftpc.newhost);
    (pcVar26->proto).ftpc.newhost = (char *)0x0;
    iVar16 = (pcVar26->proto).ftpc.count1;
    if ((int)local_190 == 0xe5 && iVar16 == 0) {
      pcVar21 = strchr(pcVar21,0x28);
      if ((((pcVar21 == (char *)0x0) || (cVar4 = pcVar21[1], pcVar21[2] != cVar4)) ||
          (pcVar21[3] != cVar4)) ||
         ((9 < (byte)(pcVar21[4] - 0x30U) ||
          (uVar19 = strtoul(pcVar21 + 4,(char **)&size,10), *(char *)size != cVar4)))) {
        pcVar21 = "Weirdly formatted EPSV reply";
      }
      else {
        if (uVar19 < 0x10000) {
          (pcVar26->proto).ftpc.newport = (unsigned_short)uVar19;
          if (((uint)pcVar26->bits & 10) == 0) {
            pcVar21 = pcVar26->primary_ip;
          }
          else {
            pcVar21 = (pcVar26->host).name;
          }
          pcVar21 = (*Curl_cstrdup)(pcVar21);
          (pcVar26->proto).ftpc.newhost = pcVar21;
          if (pcVar21 != (char *)0x0) {
LAB_004f8bad:
            CVar6 = pcVar26->bits;
            if (((uint)CVar6 & 0x20) == 0) {
              if ((((uint)CVar6 & 0x1000080) == 0x1000000) && (*pcVar21 == '\0')) {
                Curl_conn_ev_update_info(data,pcVar26);
                (*Curl_cfree)((pcVar26->proto).ftpc.newhost);
                (pcVar26->proto).ftpc.newhost = (char *)0x0;
                if (((uint)pcVar26->bits & 10) == 0) {
                  pcVar21 = pcVar26->primary_ip;
                }
                else {
                  pcVar21 = (pcVar26->host).name;
                }
                pcVar21 = (*Curl_cstrdup)(pcVar21);
                (pcVar26->proto).ftpc.newhost = pcVar21;
                if (pcVar21 == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
              }
              Curl_resolv(data,pcVar21,(uint)(pcVar26->proto).ftpc.newport,false,&addr);
              uVar31 = (uint)(pcVar26->proto).ftpc.newport;
              if (addr == (Curl_dns_entry *)0x0) {
                Curl_failf(data,"Can\'t resolve new host %s:%hu",(pcVar26->proto).ftpc.newhost,
                           (ulong)uVar31);
                return CURLE_FTP_CANT_GET_HOST;
              }
            }
            else {
              ppVar12 = &pcVar26->socks_proxy;
              if (((uint)CVar6 & 2) == 0) {
                ppVar12 = &pcVar26->http_proxy;
              }
              pcVar21 = (ppVar12->host).name;
              Curl_resolv(data,pcVar21,pcVar26->port,false,&addr);
              uVar31 = pcVar26->port;
              if (addr == (Curl_dns_entry *)0x0) {
                Curl_failf(data,"Can\'t resolve proxy host %s:%hu",pcVar21,(ulong)(uVar31 & 0xffff))
                ;
                return CURLE_COULDNT_RESOLVE_PROXY;
              }
            }
            CVar15 = Curl_conn_setup(data,pcVar26,1,addr,(uint)pcVar26->bits >> 0x13 & 1);
            if (CVar15 != CURLE_OK) {
              Curl_resolv_unlock(data,addr);
              if ((int)local_190 != 0xe5) {
                return CVar15;
              }
              if ((pcVar26->proto).ftpc.count1 != 0) {
                return CVar15;
              }
              goto LAB_004f8902;
            }
            if (((data->set).field_0x8bd & 0x10) != 0) {
              pcVar21 = (pcVar26->proto).ftpc.newhost;
              Curl_printable_address(addr->addr,(char *)&size,0x100);
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Connecting to %s (%s) port %d",pcVar21,&size,
                           (ulong)(uVar31 & 0xffff));
              }
            }
            Curl_resolv_unlock(data,addr);
            (*Curl_cfree)(pcVar26->secondaryhostname);
            pcVar26->secondaryhostname = (char *)0x0;
            pcVar26->secondary_port = (pcVar26->proto).ftpc.newport;
            pcVar21 = (*Curl_cstrdup)((pcVar26->proto).ftpc.newhost);
            pcVar26->secondaryhostname = pcVar21;
            if (pcVar21 != (char *)0x0) {
              puVar3 = &(pcVar26->bits).field_0x1;
              *puVar3 = *puVar3 | 0x20;
              (data->conn->proto).ftpc.state = '\0';
              return CURLE_OK;
            }
          }
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar21 = "Illegal port number in EPSV reply";
      }
      Curl_failf(data,pcVar21);
    }
    else {
      if ((int)local_190 == 0xe3 && iVar16 == 1) {
        local_180 = pcVar26;
LAB_004f8392:
        if (*pcVar21 == '\0') {
LAB_004f88e4:
          Curl_failf(data,"Couldn\'t interpret the 227-response");
          return CURLE_FTP_WEIRD_227_FORMAT;
        }
        lVar32 = 0;
        pcVar22 = pcVar21;
        do {
          pcVar26 = local_180;
          if (lVar32 == 6) {
            if (*pcVar21 == '\0') goto LAB_004f88e4;
            uVar31 = (uint)*(undefined8 *)&(data->set).field_0x8ba;
            if ((uVar31 >> 0x10 & 1) == 0) {
              pcVar21 = curl_maprintf("%u.%u.%u.%u",size & 0xffffffff,(ulong)size._4_4_,
                                      uStack_130 & 0xffffffff,(ulong)uStack_130._4_4_);
              pcVar26 = local_180;
            }
            else {
              if ((uVar31 >> 0x1c & 1) != 0) {
                Curl_infof(data,"Skip %u.%u.%u.%u for data connection, reuse %s instead",
                           size & 0xffffffff,(ulong)size._4_4_,uStack_130 & 0xffffffff,
                           (ulong)uStack_130._4_4_,(local_180->host).name);
              }
              if (((uint)pcVar26->bits & 10) == 0) {
                pcVar21 = pcVar26->primary_ip;
              }
              else {
                pcVar21 = (pcVar26->host).name;
              }
              pcVar21 = (*Curl_cstrdup)(pcVar21);
            }
            (pcVar26->proto).ftpc.newhost = pcVar21;
            if (pcVar21 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            (pcVar26->proto).ftpc.newport =
                 (short)((int)local_128 << 8) + (short)(local_128 >> 0x20);
            goto LAB_004f8bad;
          }
          if (lVar32 != 0) {
            if (*pcVar22 != ',') goto LAB_004f83e4;
            pcVar22 = pcVar22 + 1;
          }
          if ((9 < (byte)(*pcVar22 - 0x30U)) ||
             (uVar19 = strtoul(pcVar22,(char **)&filesize,10), 0xff < uVar19)) goto LAB_004f83e4;
          *(int *)((long)&size + lVar32 * 4) = (int)uVar19;
          lVar32 = lVar32 + 1;
          pcVar22 = (char *)filesize;
        } while( true );
      }
      if (iVar16 == 0) {
LAB_004f8902:
        CVar15 = ftp_epsv_disable(data,pcVar26);
        return CVar15;
      }
      Curl_failf(data,"Bad PASV/EPSV response: %03d",local_190);
    }
    CVar15 = CURLE_FTP_WEIRD_PASV_REPLY;
    break;
  case '\x1f':
  case ' ':
    pcVar26 = data->conn;
    pFVar7 = (data->req).p.ftp;
    if ((ftpcode != 0x96) && (ftpcode != 0x7d)) {
      if (ftpcode == 0x1c2 && instate == '\x1f') {
        pFVar7->transfer = PPTRANSFER_NONE;
        (pcVar26->proto).ftpc.state = '\0';
        return CURLE_OK;
      }
      Curl_failf(data,"RETR response: %03d",local_190);
      CVar15 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (instate != ' ') {
        CVar15 = CURLE_FTP_COULDNT_RETR_FILE;
      }
      if (ftpcode != 0x226) {
        return CURLE_FTP_COULDNT_RETR_FILE;
      }
      return CVar15;
    }
    size = -1;
    if ((((instate == '\x1f') || (((data->state).field_0x74d & 0x40) != 0)) ||
        (((data->set).field_0x8be & 4) != 0)) || (0 < pFVar7->downloadsize)) {
      lVar32 = pFVar7->downloadsize;
      cVar25 = lVar32;
      if (lVar32 < 0) {
        lVar32 = -1;
        cVar25 = size;
      }
    }
    else {
      pcVar21 = Curl_dyn_ptr(&(pcVar26->proto).ftpc.pp.recvbuf);
      pcVar22 = strstr(pcVar21," bytes");
      lVar32 = -1;
      cVar25 = size;
      if (pcVar22 != (char *)0x0) {
        pcVar21 = pcVar21 + (2 - (long)pcVar22);
        for (; (pcVar21 != (char *)0x0 && (pcVar22[-1] != '(')); pcVar22 = pcVar22 + -1) {
          lVar32 = -1;
          if (9 < (byte)(pcVar22[-1] - 0x30U)) goto LAB_004f8402;
          pcVar21 = pcVar21 + 1;
        }
        curlx_strtoofft(pcVar22,(char **)0x0,10,&size);
        lVar32 = size;
        cVar25 = size;
      }
    }
LAB_004f8402:
    size = cVar25;
    lVar9 = (data->req).maxdownload;
    if (lVar9 < 1 || lVar32 <= lVar9) {
      if ((instate != '\x1f') && (((data->state).field_0x74d & 0x40) != 0)) {
        size = -1;
      }
    }
    else {
      (data->req).size = lVar9;
      size = lVar9;
    }
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"Maxdownload = %ld");
    }
    if ((instate != '\x1f') && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Getting file with size: %ld",size);
    }
    (pcVar26->proto).ftpc.state_saved = instate;
    (pcVar26->proto).ftpc.retr_size_saved = size;
    if (((data->set).field_0x8bb & 0x10) != 0) {
      CVar15 = AllowServerConnect(data,(_Bool *)&filesize);
      if (CVar15 != CURLE_OK) {
        return CVar15;
      }
      if ((char)filesize == '\0') {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"Data conn was not available immediately");
        }
        (data->conn->proto).ftpc.state = '\0';
        pbVar2 = (byte *)((long)&pcVar26->proto + 0x112);
        *pbVar2 = *pbVar2 | 0x20;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
    goto LAB_004f8499;
  case '!':
    if (399 < ftpcode) {
      Curl_failf(data,"Failed FTP upload: %0d");
      (data->conn->proto).ftpc.state = '\0';
      return CURLE_UPLOAD_FAILED;
    }
    pcVar26 = data->conn;
    (pcVar26->proto).ftpc.state_saved = '!';
    if (((data->set).field_0x8bb & 0x10) != 0) {
      (data->conn->proto).ftpc.state = '\0';
      CVar15 = AllowServerConnect(data,(_Bool *)&size);
      if (CVar15 != CURLE_OK) {
        return CVar15;
      }
      if ((char)size == '\0') {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"Data conn was not available immediately");
        }
        pbVar2 = (byte *)((long)&pcVar26->proto + 0x112);
        *pbVar2 = *pbVar2 | 0x20;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
LAB_004f8499:
    CVar15 = InitiateTransfer(data);
  }
  return CVar15;
LAB_004f83e4:
  pcVar21 = pcVar21 + 1;
  goto LAB_004f8392;
LAB_004f8847:
  if (pcVar21[1] == '\"') {
    if (pcVar21[2] != '\"') {
      sVar24 = Curl_dyn_len((dynbuf *)&size);
      if (sVar24 == 0) goto LAB_004f8b2b;
      pcVar21 = Curl_dyn_ptr((dynbuf *)&size);
      if (((conn->proto).ftpc.server_os == (char *)0x0) && (*pcVar21 != '/')) {
        CVar15 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SYST");
        if (CVar15 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.entrypath);
          (conn->proto).ftpc.entrypath = pcVar21;
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"Entry path is \'%s\'",pcVar21);
            pcVar21 = (conn->proto).ftpc.entrypath;
          }
          (data->state).most_recent_ftp_entrypath = pcVar21;
          (data->conn->proto).ftpc.state = '\n';
          return CURLE_OK;
        }
        (*Curl_cfree)(pcVar21);
        return CVar15;
      }
      (*Curl_cfree)((conn->proto).ftpc.entrypath);
      (conn->proto).ftpc.entrypath = pcVar21;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"Entry path is \'%s\'",pcVar21);
        pcVar21 = (conn->proto).ftpc.entrypath;
      }
      (data->state).most_recent_ftp_entrypath = pcVar21;
      goto switchD_004f7946_default;
    }
    pcVar21 = pcVar21 + 2;
  }
  else {
    if (pcVar21[1] == '\0') goto LAB_004f8b2b;
    pcVar21 = pcVar21 + 1;
  }
  CVar15 = Curl_dyn_addn((dynbuf *)&size,pcVar21,1);
  if (CVar15 != CURLE_OK) {
    return CVar15;
  }
  goto LAB_004f8847;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char * const ftpauth[] = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230) {
        /* 230 User logged in - already! Take as 220 if TLS required. */
        if(data->set.use_ssl <= CURLUSESSL_TRY ||
           conn->bits.ftp_use_control_ssl)
          return ftp_state_user_resp(data, ftpcode);
      }
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn)) {
          failf(data, "secure login failed");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We don't have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          ftp_state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      if(pp->overflow)
        return CURLE_WEIRD_SERVER_REPLY; /* Forbid pipelining in response. */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* this was BLOCKING, keep it so for now */
        bool done;
        if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
          result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
          if(result) {
            /* we failed and bail out */
            return CURLE_USE_SSL_FAILED;
          }
        }
        result = Curl_conn_connect(data, FIRSTSOCKET, TRUE, &done);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        ftp_state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          ftp_state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_cfilter_remove(data, FIRSTSOCKET);

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        bool entry_extracted = FALSE;
        struct dynbuf out;
        Curl_dyn_init(&out, 1000);

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(*ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          for(ptr++; *ptr; ptr++) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                result = Curl_dyn_addn(&out, &ptr[1], 1);
                ptr++;
              }
              else {
                /* end of path */
                if(Curl_dyn_len(&out))
                  entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              result = Curl_dyn_addn(&out, ptr, 1);
            if(result)
              return result;
          }
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */
          char *dir = Curl_dyn_ptr(&out);

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            ftp_state(data, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          Curl_dyn_free(&out);
          infof(data, "Failed to figure out path");
        }
      }
      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        char *os;
        char *start;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(start = ptr; *ptr && *ptr != ' '; ptr++)
          ;
        os = Curl_memdup0(start, ptr - start);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Check for special servers here. */
        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          ftp_state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */

          /* count3 is set to allow MKD to fail once per dir. In the case when
          CWD fails and then MKD fails (due to another session raced it to
          create the dir) this then allows for a second try to CWD to it. */
          ftpc->count3 = (data->set.ftp_create_missing_dirs == 2) ? 1 : 0;

          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            ftp_state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        ftp_state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
    default:
      /* internal error */
      ftp_state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}